

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

int __thiscall vkt::ubo::UniformBlockCase::init(UniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  UniformLayout *layout;
  uint uVar1;
  DataType dataType;
  MatrixLoadFlags MVar2;
  UniformBlock *pUVar3;
  pointer pBVar4;
  pointer pUVar5;
  pointer puVar6;
  _Base_ptr p_Var7;
  pointer pBVar8;
  pointer pSVar9;
  bool bVar10;
  int iVar11;
  DataType DVar12;
  int iVar13;
  ulong uVar14;
  pointer pUVar15;
  mapped_type *ppvVar16;
  const_iterator cVar17;
  char *pcVar18;
  ostream *poVar19;
  uint uVar20;
  int iVar21;
  pointer pBVar22;
  uint uVar23;
  int iVar24;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar25;
  undefined8 extraout_RDX_02;
  pointer __rhs;
  pointer pUVar26;
  long lVar27;
  deUint32 dVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int blockNdx;
  ulong uVar32;
  _Alloc_hider _Var33;
  bool bVar34;
  bool bVar35;
  MatrixLoadFlags in_stack_fffffffffffffd78;
  int local_268;
  int curOffset;
  UniformLayout *local_260;
  ulong local_258;
  ulong local_250;
  pointer local_248;
  int local_240;
  int local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string blockPrefix;
  int local_1e8;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  pointer local_1a0;
  pointer piStack_198;
  pointer local_190;
  undefined8 local_188;
  int local_180;
  string local_50;
  
  layout = &this->m_uniformLayout;
  this_00 = &this->m_interface;
  uVar14 = (ulong)((long)(this->m_interface).m_uniformBlocks.
                         super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_uniformBlocks.
                        super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 4;
  uVar32 = 0;
  local_250 = uVar14 & 0xffffffff;
  if ((int)uVar14 < 1) {
    local_250 = uVar32;
  }
  while (uVar32 != local_250) {
    pUVar3 = (this->m_interface).m_uniformBlocks.
             super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar32].m_ptr;
    if ((pUVar3->m_instanceName)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockPrefix,"",(allocator<char> *)&rnd);
    }
    else {
      std::operator+(&blockPrefix,&pUVar3->m_blockName,".");
    }
    curOffset = 0;
    pBVar22 = (this->m_uniformLayout).blocks.
              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pBVar4 = (this->m_uniformLayout).blocks.
             super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_248 = (pointer)((ulong)((long)(this->m_uniformLayout).uniforms.
                                        super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_uniformLayout).uniforms.
                                       super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 6);
    for (__rhs = (pUVar3->m_uniforms).
                 super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>._M_impl.
                 super__Vector_impl_data._M_start; iVar11 = curOffset,
        __rhs != *(pointer *)
                  ((long)&(pUVar3->m_uniforms).
                          super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>
                  + 8); __rhs = __rhs + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                     &blockPrefix,&__rhs->m_name);
      uVar23 = *(uint *)&((vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *)
                         &pUVar3->m_flags)->
                         super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>;
      uVar1 = *(uint *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__rhs->m_flags)->_M_dataplus;
      uVar20 = uVar1;
      if ((uVar1 & 0x20) == 0) {
        uVar20 = uVar23;
      }
      if ((uVar1 & 0xc0) == 0) {
        uVar1 = uVar23;
      }
      ubo::anon_unknown_0::computeStd140Layout
                (layout,&curOffset,(int)(((long)pBVar22 - (long)pBVar4) / 0x50),(string *)&rnd,
                 (VarType *)&__rhs->m_type,uVar1 & 0xc0 | uVar20 & 0x20);
      std::__cxx11::string::~string((string *)&rnd);
    }
    pUVar26 = (this->m_uniformLayout).uniforms.
              super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pUVar5 = (this->m_uniformLayout).uniforms.
             super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar13 = *(int *)&((vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *)
                      &pUVar3->m_arraySize)->
                      super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>;
    if (iVar13 < 2) {
      iVar13 = 1;
    }
    local_258 = uVar32;
    for (local_268 = 0; local_268 < iVar13; local_268 = local_268 + 1) {
      rnd.m_rnd._0_8_ = &local_1b8;
      rnd.m_rnd.z = 0;
      rnd.m_rnd.w = 0;
      local_1b8._M_local_buf[0] = '\0';
      local_1a8 = 0;
      local_190 = (pointer)0x0;
      local_1a0 = (pointer)0x0;
      piStack_198 = (pointer)0x0;
      local_188._0_4_ = -1;
      local_188._4_4_ = -1;
      local_180 = -1;
      std::vector<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>::
      emplace_back<vkt::ubo::BlockLayoutEntry>(&layout->blocks,(BlockLayoutEntry *)&rnd);
      BlockLayoutEntry::~BlockLayoutEntry((BlockLayoutEntry *)&rnd);
      pBVar22 = (this->m_uniformLayout).blocks.
                super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_assign((string *)(pBVar22 + -1));
      pBVar22[-1].size = iVar11;
      pBVar22[-1].bindingNdx = (int)local_258;
      pBVar22[-1].blockDeclarationNdx = (int)local_258;
      pBVar22[-1].instanceNdx = local_268;
      pUVar15 = local_248;
      while( true ) {
        rnd.m_rnd.x = (deUint32)pUVar15;
        if ((int)((ulong)((long)pUVar26 - (long)pUVar5) >> 6) <= (int)(deUint32)pUVar15) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pBVar22[-1].activeUniformIndices,(value_type_conflict1 *)&rnd);
        pUVar15 = (pointer)(ulong)(rnd.m_rnd.x + 1);
      }
      if (0 < *(int *)&((vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *)
                       &pUVar3->m_arraySize)->
                       super__Vector_base<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>) {
        de::toString<int>(&local_50,&local_268);
        std::operator+(&local_238,"[",&local_50);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                       &local_238,"]");
        std::__cxx11::string::append((string *)(pBVar22 + -1));
        std::__cxx11::string::~string((string *)&rnd);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    std::__cxx11::string::~string((string *)&blockPrefix);
    uVar32 = local_258 + 1;
  }
  iVar11 = 0;
  for (pBVar22 = (this->m_uniformLayout).blocks.
                 super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pBVar22 !=
      (this->m_uniformLayout).blocks.
      super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish; pBVar22 = pBVar22 + 1) {
    iVar11 = iVar11 + pBVar22->size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,(long)iVar11);
  local_260 = (UniformLayout *)&this->m_blockPointers;
  pBVar22 = (this->m_uniformLayout).blocks.
            super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar28 = 0;
  iVar11 = 0;
  while( true ) {
    rnd.m_rnd.x = dVar28;
    if ((int)(((long)(this->m_uniformLayout).blocks.
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar22) / 0x50) <=
        (int)dVar28) break;
    puVar6 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppvVar16 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_260,(key_type_conflict *)&rnd);
    *ppvVar16 = puVar6 + iVar11;
    pBVar22 = (layout->blocks).
              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = iVar11 + pBVar22[(int)rnd.m_rnd.x].size;
    dVar28 = rnd.m_rnd.x + 1;
  }
  deRandom_init(&rnd.m_rnd,1);
  pBVar22 = (this->m_uniformLayout).blocks.
            super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pBVar4 = (this->m_uniformLayout).blocks.
           super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  blockPrefix._M_dataplus._M_p._0_4_ = 0;
  do {
    local_1e8 = (int)(((long)pBVar22 - (long)pBVar4) / 0x50);
    if (local_1e8 <= (int)(uint)blockPrefix._M_dataplus._M_p) {
      MVar2 = this->m_matrixLoadFlag;
      bVar34 = this->m_shuffleUniformMembers;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
      pcVar18 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
      poVar19 = std::operator<<((ostream *)&rnd,pcVar18);
      std::operator<<(poVar19,"\n");
      std::operator<<((ostream *)&rnd,"layout(location = 0) in highp vec4 a_position;\n");
      std::operator<<((ostream *)&rnd,"layout(location = 0) out mediump float v_vtxResult;\n");
      std::operator<<((ostream *)&rnd,"\n");
      local_238._M_dataplus._M_p = (pointer)0x0;
      local_238._M_string_length = 0;
      local_238.field_2._M_allocated_capacity = 0;
      ShaderInterface::getNamedStructs
                (this_00,(vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          *)&local_238);
      uVar25 = extraout_RDX;
      for (_Var33._M_p = local_238._M_dataplus._M_p;
          _Var33._M_p != (pointer)local_238._M_string_length; _Var33._M_p = _Var33._M_p + 8) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&rnd,*(StructType **)_Var33._M_p,(int)uVar25);
        uVar25 = extraout_RDX_00;
      }
      lVar31 = 0;
      for (lVar27 = 0;
          pSVar9 = (this->m_interface).m_uniformBlocks.
                   super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar27 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                       super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9) >>
                        4); lVar27 = lVar27 + 1) {
        pUVar3 = *(UniformBlock **)((long)&pSVar9->m_ptr + lVar31);
        if ((pUVar3->m_flags & 0x200) != 0) {
          ubo::anon_unknown_0::generateDeclaration
                    ((ostringstream *)&rnd,(int)lVar27,pUVar3,layout,bVar34);
        }
        lVar31 = lVar31 + 0x10;
      }
      std::operator<<((ostream *)&rnd,"\n");
      ubo::anon_unknown_0::generateCompareFuncs((ostream *)&rnd,this_00);
      std::operator<<((ostream *)&rnd,
                      "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n"
                     );
      ubo::anon_unknown_0::generateCompareSrc
                ((ostringstream *)&rnd,(char *)this_00,(ShaderInterface *)layout,local_260,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )0x1,SUB41(MVar2,0),in_stack_fffffffffffffd78);
      std::operator<<((ostream *)&rnd,"\tv_vtxResult = result;\n}\n");
      std::__cxx11::stringbuf::str();
      std::_Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                       *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
      std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,(string *)&blockPrefix);
      std::__cxx11::string::~string((string *)&blockPrefix);
      MVar2 = this->m_matrixLoadFlag;
      bVar34 = this->m_shuffleUniformMembers;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
      pcVar18 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
      poVar19 = std::operator<<((ostream *)&rnd,pcVar18);
      std::operator<<(poVar19,"\n");
      std::operator<<((ostream *)&rnd,"layout(location = 0) in mediump float v_vtxResult;\n");
      std::operator<<((ostream *)&rnd,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
      std::operator<<((ostream *)&rnd,"\n");
      local_238._M_dataplus._M_p = (pointer)0x0;
      local_238._M_string_length = 0;
      local_238.field_2._M_allocated_capacity = 0;
      ShaderInterface::getNamedStructs
                (this_00,(vector<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                          *)&local_238);
      uVar25 = extraout_RDX_01;
      for (_Var33._M_p = local_238._M_dataplus._M_p;
          _Var33._M_p != (pointer)local_238._M_string_length; _Var33._M_p = _Var33._M_p + 8) {
        ubo::anon_unknown_0::generateDeclaration
                  ((ostringstream *)&rnd,*(StructType **)_Var33._M_p,(int)uVar25);
        uVar25 = extraout_RDX_02;
      }
      lVar31 = 0;
      for (lVar27 = 0;
          pSVar9 = (this->m_interface).m_uniformBlocks.
                   super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar27 < (int)((ulong)((long)(this->m_interface).m_uniformBlocks.
                                       super__Vector_base<de::SharedPtr<vkt::ubo::UniformBlock>,_std::allocator<de::SharedPtr<vkt::ubo::UniformBlock>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9) >>
                        4); lVar27 = lVar27 + 1) {
        pUVar3 = *(UniformBlock **)((long)&pSVar9->m_ptr + lVar31);
        if ((pUVar3->m_flags & 0x400) != 0) {
          ubo::anon_unknown_0::generateDeclaration
                    ((ostringstream *)&rnd,(int)lVar27,pUVar3,layout,bVar34);
        }
        lVar31 = lVar31 + 0x10;
      }
      std::operator<<((ostream *)&rnd,"\n");
      ubo::anon_unknown_0::generateCompareFuncs((ostream *)&rnd,this_00);
      std::operator<<((ostream *)&rnd,"\nvoid main (void)\n{\n\tmediump float result = 1.0;\n");
      ubo::anon_unknown_0::generateCompareSrc
                ((ostringstream *)&rnd,(char *)this_00,(ShaderInterface *)layout,local_260,
                 (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *
                 )0x0,SUB41(MVar2,0),in_stack_fffffffffffffd78);
      std::operator<<((ostream *)&rnd,"\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n"
                     );
      std::__cxx11::stringbuf::str();
      std::_Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
      ::~_Vector_base((_Vector_base<const_vkt::ubo::StructType_*,_std::allocator<const_vkt::ubo::StructType_*>_>
                       *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
      std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,(string *)&blockPrefix);
      iVar11 = std::__cxx11::string::~string((string *)&blockPrefix);
      return iVar11;
    }
    cVar17 = std::
             _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
             ::find((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_260,(key_type_conflict *)&blockPrefix);
    p_Var7 = cVar17._M_node[1]._M_parent;
    uVar14 = (ulong)(int)(uint)blockPrefix._M_dataplus._M_p;
    pBVar8 = (layout->blocks).
             super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar32 = (ulong)((long)*(pointer *)
                            ((long)&pBVar8[uVar14].activeUniformIndices.
                                    super__Vector_base<int,_std::allocator<int>_> + 8) -
                    *(long *)&pBVar8[uVar14].activeUniformIndices.
                              super__Vector_base<int,_std::allocator<int>_>) >> 2;
    uVar29 = uVar32 & 0xffffffff;
    if ((int)uVar32 < 1) {
      uVar29 = 0;
    }
    for (uVar32 = 0; uVar32 != uVar29; uVar32 = uVar32 + 1) {
      pUVar5 = (this->m_uniformLayout).uniforms.
               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = *(int *)(*(long *)&(this->m_uniformLayout).blocks.
                                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].
                                  activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>
                       + uVar32 * 4);
      pUVar26 = pUVar5 + iVar11;
      DVar12 = glu::getDataTypeScalarType(pUVar5[iVar11].type);
      iVar13 = glu::getDataTypeScalarSize(pUVar5[iVar11].type);
      dataType = pUVar5[iVar11].type;
      bVar34 = dataType - TYPE_FLOAT_MAT2 < 9;
      bVar35 = dataType - TYPE_DOUBLE_MAT2 < 9;
      iVar11 = 1;
      if (bVar35 || bVar34) {
        if (pUVar26->isRowMajor == true) {
          iVar11 = glu::getDataTypeMatrixNumRows(dataType);
        }
        else {
          iVar11 = glu::getDataTypeMatrixNumColumns(dataType);
        }
      }
      uVar14 = (long)iVar13 / (long)iVar11 & 0xffffffff;
      iVar24 = pUVar26->size;
      iVar21 = 0;
      if ((int)((long)iVar13 / (long)iVar11) < 1) {
        uVar14 = 0;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_250 = CONCAT44(local_250._4_4_,iVar11);
      local_248 = pUVar26;
      local_240 = iVar24;
      while (iVar21 < iVar24) {
        iVar13 = pUVar26->arrayStride * iVar21;
        iVar24 = 0;
        if (local_240 < 2) {
          iVar13 = 0;
        }
        local_258 = (long)&p_Var7->_M_color + (long)iVar13 + (long)pUVar26->offset;
        local_23c = iVar21;
        for (; iVar24 != iVar11; iVar24 = iVar24 + 1) {
          lVar31 = (long)(pUVar26->matrixStride * iVar24);
          if (!bVar35 && !bVar34) {
            lVar31 = 0;
          }
          lVar31 = lVar31 + local_258;
          for (lVar27 = 0; uVar14 * 4 != lVar27; lVar27 = lVar27 + 4) {
            lVar30 = (long)(int)lVar27;
            if (DVar12 == TYPE_BOOL) {
              bVar10 = de::Random::getBool((Random *)&rnd.m_rnd);
              uVar23 = 0;
              if (bVar10) {
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar23 = dVar28 | 1;
              }
              *(uint *)(lVar31 + lVar30) = uVar23;
            }
            else {
              if (DVar12 == TYPE_INT) {
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar23 = dVar28 % 0x13 - 9;
              }
              else {
                if (DVar12 != TYPE_UINT) {
                  if (DVar12 == TYPE_FLOAT) {
                    dVar28 = deRandom_getUint32(&rnd.m_rnd);
                    *(float *)(lVar31 + lVar30) = (float)(int)(dVar28 % 0x13 - 9);
                  }
                  goto LAB_0066456b;
                }
                dVar28 = deRandom_getUint32(&rnd.m_rnd);
                uVar23 = dVar28 % 10;
              }
              *(uint *)(lVar31 + lVar30) = uVar23;
            }
LAB_0066456b:
          }
          pUVar26 = local_248;
          iVar11 = (int)local_250;
        }
        iVar24 = pUVar26->size;
        iVar21 = local_23c + 1;
      }
      uVar14 = (ulong)(uint)blockPrefix._M_dataplus._M_p;
    }
    blockPrefix._M_dataplus._M_p._0_4_ = (int)uVar14 + 1;
  } while( true );
}

Assistant:

void UniformBlockCase::init (void)
{
	// Compute reference layout.
	computeStd140Layout(m_uniformLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (std::vector<BlockLayoutEntry>::const_iterator blockIter = m_uniformLayout.blocks.begin(); blockIter != m_uniformLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		m_data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)m_uniformLayout.blocks.size(); blockNdx++)
		{
			m_blockPointers[blockNdx] = &m_data[0] + curOffset;
			curOffset += m_uniformLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(m_uniformLayout, m_blockPointers, 1 /* seed */);

	// Generate shaders.
	m_vertShaderSource = generateVertexShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
	m_fragShaderSource = generateFragmentShader(m_interface, m_uniformLayout, m_blockPointers, m_matrixLoadFlag, m_shuffleUniformMembers);
}